

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O0

bool absl::lts_20250127::debugging_internal::ParseNumber(State *state,int *number_out)

{
  bool bVar1;
  bool bVar2;
  uint uVar3;
  char *pcVar4;
  uint64_t number;
  char *p;
  bool negative;
  ComplexityGuard guard;
  int *number_out_local;
  State *state_local;
  
  guard.state_ = (State *)number_out;
  anon_unknown_3::ComplexityGuard::ComplexityGuard
            ((ComplexityGuard *)&stack0xffffffffffffffd8,state);
  bVar1 = anon_unknown_3::ComplexityGuard::IsTooComplex((ComplexityGuard *)&stack0xffffffffffffffd8)
  ;
  if (bVar1) {
    state_local._7_1_ = false;
  }
  else {
    bVar1 = ParseOneCharToken(state,'n');
    number = (uint64_t)RemainingInput(state);
    uVar3 = 0;
    while ((*(char *)number != '\0' && (bVar2 = IsDigit(*(char *)number), bVar2))) {
      uVar3 = uVar3 * 10 + *(char *)number + -0x30;
      number = number + 1;
    }
    if (bVar1) {
      uVar3 = (uVar3 ^ 0xffffffff) + 1;
    }
    pcVar4 = RemainingInput(state);
    if ((char *)number == pcVar4) {
      state_local._7_1_ = false;
    }
    else {
      pcVar4 = RemainingInput(state);
      (state->parse_state).mangled_idx =
           (state->parse_state).mangled_idx + ((int)number - (int)pcVar4);
      anon_unknown_3::UpdateHighWaterMark(state);
      if (guard.state_ != (State *)0x0) {
        *(uint *)&(guard.state_)->mangled_begin = uVar3;
      }
      state_local._7_1_ = true;
    }
  }
  anon_unknown_3::ComplexityGuard::~ComplexityGuard((ComplexityGuard *)&stack0xffffffffffffffd8);
  return state_local._7_1_;
}

Assistant:

static bool ParseNumber(State *state, int *number_out) {
  ComplexityGuard guard(state);
  if (guard.IsTooComplex()) return false;
  bool negative = false;
  if (ParseOneCharToken(state, 'n')) {
    negative = true;
  }
  const char *p = RemainingInput(state);
  uint64_t number = 0;
  for (; *p != '\0'; ++p) {
    if (IsDigit(*p)) {
      number = number * 10 + static_cast<uint64_t>(*p - '0');
    } else {
      break;
    }
  }
  // Apply the sign with uint64_t arithmetic so overflows aren't UB.  Gives
  // "incorrect" results for out-of-range inputs, but negative values only
  // appear for literals, which aren't printed.
  if (negative) {
    number = ~number + 1;
  }
  if (p != RemainingInput(state)) {  // Conversion succeeded.
    state->parse_state.mangled_idx += p - RemainingInput(state);
    UpdateHighWaterMark(state);
    if (number_out != nullptr) {
      // Note: possibly truncate "number".
      *number_out = static_cast<int>(number);
    }
    return true;
  }
  return false;
}